

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

int Gia_ManComputeEdgeDelay2(Gia_Man_t *p)

{
  uint uVar1;
  bool bVar2;
  Vec_Int_t *vFanMax1;
  long lVar3;
  int *piVar4;
  Vec_Int_t *vCountMax;
  Vec_Int_t *pVVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  Vec_Int_t *local_58;
  int *local_40;
  
  iVar8 = p->nObjs;
  vFanMax1 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar9 = iVar8;
  }
  vFanMax1->nCap = iVar9;
  if (iVar9 == 0) {
    vFanMax1->pArray = (int *)0x0;
    vFanMax1->nSize = iVar8;
    local_58 = (Vec_Int_t *)malloc(0x10);
    local_58->nCap = 0;
    local_58->pArray = (int *)0x0;
    local_58->nSize = iVar8;
    vCountMax = (Vec_Int_t *)malloc(0x10);
    vCountMax->nCap = 0;
    local_40 = (int *)0x0;
    vCountMax->pArray = (int *)0x0;
    vCountMax->nSize = iVar8;
  }
  else {
    lVar3 = (long)iVar8;
    sVar11 = (long)iVar9 << 2;
    local_40 = (int *)malloc(sVar11);
    vFanMax1->pArray = local_40;
    vFanMax1->nSize = iVar8;
    if (local_40 != (int *)0x0) {
      memset(local_40,0,lVar3 * 4);
    }
    local_58 = (Vec_Int_t *)malloc(0x10);
    local_58->nCap = iVar9;
    piVar4 = (int *)malloc(sVar11);
    local_58->pArray = piVar4;
    local_58->nSize = iVar8;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0,lVar3 * 4);
    }
    vCountMax = (Vec_Int_t *)malloc(0x10);
    vCountMax->nCap = iVar9;
    piVar4 = (int *)malloc(sVar11);
    vCountMax->pArray = piVar4;
    vCountMax->nSize = iVar8;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0,lVar3 << 2);
    }
  }
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x23e,"int Gia_ManComputeEdgeDelay2(Gia_Man_t *)");
  }
  pVVar5 = p->vEdgeDelay;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vEdgeDelay->pArray = (int *)0x0;
      pVVar5 = p->vEdgeDelay;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_001f9246;
    }
    free(pVVar5);
    p->vEdgeDelay = (Vec_Int_t *)0x0;
  }
LAB_001f9246:
  pVVar5 = p->vEdge1;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vEdge1->pArray = (int *)0x0;
      pVVar5 = p->vEdge1;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_001f928e;
    }
    free(pVVar5);
    p->vEdge1 = (Vec_Int_t *)0x0;
  }
LAB_001f928e:
  pVVar5 = p->vEdge2;
  if (pVVar5 != (Vec_Int_t *)0x0) {
    if (pVVar5->pArray != (int *)0x0) {
      free(pVVar5->pArray);
      p->vEdge2->pArray = (int *)0x0;
      pVVar5 = p->vEdge2;
      if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_001f92d6;
    }
    free(pVVar5);
    p->vEdge2 = (Vec_Int_t *)0x0;
  }
LAB_001f92d6:
  uVar1 = p->nObjs;
  uVar7 = (ulong)uVar1;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  uVar10 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar10 = uVar1;
  }
  pVVar5->nCap = uVar10;
  if (uVar10 == 0) {
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = uVar1;
    p->vEdgeDelay = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 0;
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = uVar1;
    p->vEdge1 = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 0;
    pVVar5->pArray = (int *)0x0;
    pVVar5->nSize = uVar1;
  }
  else {
    lVar3 = (long)(int)uVar1;
    sVar11 = (long)(int)uVar10 << 2;
    piVar4 = (int *)malloc(sVar11);
    pVVar5->pArray = piVar4;
    pVVar5->nSize = uVar1;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0,lVar3 * 4);
    }
    p->vEdgeDelay = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = uVar10;
    piVar4 = (int *)malloc(sVar11);
    pVVar5->pArray = piVar4;
    pVVar5->nSize = uVar1;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0,lVar3 * 4);
    }
    p->vEdge1 = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = uVar10;
    piVar4 = (int *)malloc(sVar11);
    pVVar5->pArray = piVar4;
    pVVar5->nSize = uVar1;
    if (piVar4 != (int *)0x0) {
      memset(piVar4,0,lVar3 << 2);
    }
  }
  p->vEdge2 = pVVar5;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    if (p->vMapping2 == (Vec_Wec_t *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0x24d,"int Gia_ManComputeEdgeDelay2(Gia_Man_t *)");
    }
    if (1 < (int)uVar1) {
      lVar3 = uVar7 * 0x10 + -0xc;
      do {
        if ((long)p->vMapping2->nSize < (long)uVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        if (*(int *)((long)&p->vMapping2->pArray->nCap + lVar3) != 0) {
          Gia_ObjComputeEdgeDelay2
                    (p,(int)uVar7 + -1,p->vEdgeDelay,p->vEdge1,p->vEdge2,vFanMax1,local_58,vCountMax
                    );
        }
        lVar3 = lVar3 + -0x10;
        bVar2 = 2 < uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar2);
    }
  }
  else if (1 < (int)uVar1) {
    do {
      if ((long)p->vMapping->nSize < (long)uVar7) goto LAB_001f95d0;
      if (p->vMapping->pArray[uVar7 - 1] != 0) {
        Gia_ObjComputeEdgeDelay2
                  (p,(int)uVar7 + -1,p->vEdgeDelay,p->vEdge1,p->vEdge2,vFanMax1,local_58,vCountMax);
      }
      bVar2 = 2 < uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar2);
  }
  lVar3 = (long)p->vCis->nSize;
  if (lVar3 < 1) {
    iVar8 = 0;
  }
  else {
    lVar6 = 0;
    iVar8 = 0;
    do {
      iVar9 = p->vCis->pArray[lVar6];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar9 == 0) break;
      if (p->vEdgeDelay->nSize <= iVar9) {
LAB_001f95d0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = p->vEdgeDelay->pArray[iVar9];
      if (iVar8 <= iVar9) {
        iVar8 = iVar9;
      }
      lVar6 = lVar6 + 1;
    } while (lVar3 != lVar6);
  }
  if (local_40 != (int *)0x0) {
    free(local_40);
  }
  free(vFanMax1);
  if (local_58->pArray != (int *)0x0) {
    free(local_58->pArray);
  }
  free(local_58);
  if (vCountMax->pArray != (int *)0x0) {
    free(vCountMax->pArray);
  }
  free(vCountMax);
  return iVar8;
}

Assistant:

int Gia_ManComputeEdgeDelay2( Gia_Man_t * p )
{
    int k, iLut, DelayMax = 0;
    Vec_Int_t * vFanMax1 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vFanMax2 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vCountMax = Vec_IntStart( Gia_ManObjNum(p) );
    assert( p->pManTime == NULL );
    Vec_IntFreeP( &p->vEdgeDelay );
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
//    Gia_ManForEachCoDriverId( p, iLut, k )
//        Vec_IntWriteEntry( p->vEdgeDelay, iLut, 1 );
    if ( Gia_ManHasMapping(p) )
        Gia_ManForEachLutReverse( p, iLut )
            Gia_ObjComputeEdgeDelay2( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, vFanMax1, vFanMax2, vCountMax );
    else if ( Gia_ManHasMapping2(p) )
        Gia_ManForEachLut2Reverse( p, iLut )
            Gia_ObjComputeEdgeDelay2( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, vFanMax1, vFanMax2, vCountMax );
    else assert( 0 );
    Gia_ManForEachCiId( p, iLut, k )
        DelayMax = Abc_MaxInt( DelayMax, Vec_IntEntry(p->vEdgeDelay, iLut) );
    Vec_IntFree( vFanMax1 );
    Vec_IntFree( vFanMax2 );
    Vec_IntFree( vCountMax );
    //printf( "The number of edges = %d.  Delay = %d.\n", Gia_ManEvalEdgeCount(p), DelayMax );
    return DelayMax;
}